

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O3

void __thiscall MppMemService::dump(MppMemService *this,char *caller)

{
  uint uVar1;
  MppMemNode *pMVar2;
  MppMemLog *pMVar3;
  int iVar4;
  char **ppcVar5;
  int iVar6;
  
  pMVar2 = this->nodes;
  _mpp_log_l(4,"mpp_mem","mpp_mem enter status dumping from %s:\n",(char *)0x0,caller);
  _mpp_log_l(4,"mpp_mem","mpp_mem node count %d:\n",(char *)0x0,(ulong)(uint)this->nodes_cnt);
  if (this->nodes_cnt != 0) {
    iVar6 = this->nodes_max;
    if (0 < iVar6) {
      ppcVar5 = &pMVar2->caller;
      iVar4 = 0;
      do {
        if (-1 < ((MppMemNode *)(ppcVar5 + -3))->index) {
          _mpp_log_l(4,"mpp_mem","mpp_memory index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                     (ulong)(uint)((MppMemNode *)(ppcVar5 + -3))->index,*ppcVar5,ppcVar5[-2],
                     ppcVar5[-1]);
          iVar6 = this->nodes_max;
        }
        iVar4 = iVar4 + 1;
        ppcVar5 = ppcVar5 + 4;
      } while (iVar4 < iVar6);
    }
  }
  pMVar2 = this->frees;
  _mpp_log_l(4,"mpp_mem","mpp_mem free count %d:\n",(char *)0x0,(ulong)(uint)this->frees_cnt);
  if (this->frees_cnt != 0) {
    iVar6 = this->frees_max;
    if (0 < iVar6) {
      ppcVar5 = &pMVar2->caller;
      iVar4 = 0;
      do {
        if (-1 < ((MppMemNode *)(ppcVar5 + -3))->index) {
          _mpp_log_l(4,"mpp_mem","mpp_freed  index %d caller %-32s size %-8u ptr %p\n",(char *)0x0,
                     (ulong)(uint)((MppMemNode *)(ppcVar5 + -3))->index,*ppcVar5,ppcVar5[-2],
                     ppcVar5[-1]);
          iVar6 = this->frees_max;
        }
        iVar4 = iVar4 + 1;
        ppcVar5 = ppcVar5 + 4;
      } while (iVar4 < iVar6);
    }
  }
  uVar1 = this->log_max;
  iVar6 = this->log_idx;
  iVar4 = this->log_cnt;
  _mpp_log_l(4,"mpp_mem","mpp_mem enter log dumping:\n",(char *)0x0);
  if (iVar4 != 0) {
    iVar6 = iVar6 - iVar4;
    iVar6 = (iVar6 >> 0x1f & uVar1) + iVar6;
    do {
      pMVar3 = this->logs;
      _mpp_log_l(4,"mpp_mem","idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",(char *)0x0
                 ,(ulong)pMVar3[iVar6].index,ops2str[pMVar3[iVar6].ops],pMVar3[iVar6].caller,
                 pMVar3[iVar6].ptr,pMVar3[iVar6].ret,pMVar3[iVar6].size_0,pMVar3[iVar6].size_1);
      iVar6 = iVar6 + 1;
      if (this->log_max <= iVar6) {
        iVar6 = 0;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void MppMemService::dump(const char *caller)
{
    RK_S32 i;
    MppMemNode *node = nodes;

    mpp_log("mpp_mem enter status dumping from %s:\n", caller);

    mpp_log("mpp_mem node count %d:\n", nodes_cnt);
    if (nodes_cnt) {
        for (i = 0; i < nodes_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_memory index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    node = frees;
    mpp_log("mpp_mem free count %d:\n", frees_cnt);
    if (frees_cnt) {
        for (i = 0; i < frees_max; i++, node++) {
            if (node->index < 0)
                continue;

            mpp_log("mpp_freed  index %d caller %-32s size %-8u ptr %p\n",
                    node->index, node->caller, node->size, node->ptr);
        }
    }

    RK_S32 start = log_idx - log_cnt;
    RK_S32 tmp_cnt = log_cnt;

    if (start < 0)
        start += log_max;

    mpp_log("mpp_mem enter log dumping:\n");

    while (tmp_cnt) {
        MppMemLog *log = &logs[start];

        mpp_log("idx %-8d op: %-7s from %-32s ptr %10p %10p size %7d %7d\n",
                log->index, ops2str[log->ops], log->caller,
                log->ptr, log->ret, log->size_0, log->size_1);

        start++;
        if (start >= log_max)
            start = 0;

        tmp_cnt--;
    }
}